

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReshapeLayerParams::ReshapeLayerParams
          (ReshapeLayerParams *this,ReshapeLayerParams *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReshapeLayerParams_0042a9c8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->targetshape_).current_size_ = 0;
  (this->targetshape_).total_size_ = 0;
  (this->targetshape_).rep_ = (Rep *)0x0;
  new_size = (from->targetshape_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->targetshape_,new_size);
    memcpy(((this->targetshape_).rep_)->elements,((from->targetshape_).rep_)->elements,
           (long)(from->targetshape_).current_size_ << 3);
    (this->targetshape_).current_size_ = (from->targetshape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->mode_ = from->mode_;
  return;
}

Assistant:

ReshapeLayerParams::ReshapeLayerParams(const ReshapeLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      targetshape_(from.targetshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  mode_ = from.mode_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReshapeLayerParams)
}